

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Exponentiation_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  Var pvVar1;
  double dVar2;
  double y;
  
  dVar2 = JavascriptConversion::ToNumber(aLeft,scriptContext);
  y = JavascriptConversion::ToNumber(aRight,scriptContext);
  dVar2 = Math::Pow(dVar2,y);
  pvVar1 = JavascriptNumber::ToVarIntCheck(dVar2,scriptContext);
  return pvVar1;
}

Assistant:

Var JavascriptMath::Exponentiation_Full(Var aLeft, Var aRight, ScriptContext *scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Exponentiation_Full);
            double x = JavascriptConversion::ToNumber(aLeft, scriptContext);
            double y = JavascriptConversion::ToNumber(aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(Math::Pow(x, y), scriptContext);
            JIT_HELPER_END(Op_Exponentiation_Full);
        }